

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreeAxisForceTorqueContactSensor.cpp
# Opt level: O0

Vector3 * __thiscall
iDynTree::ThreeAxisForceTorqueContactSensor::computeThreeAxisForceTorqueFromLoadCellMeasurements
          (ThreeAxisForceTorqueContactSensor *this,VectorDynSize *loadCellMeasurements)

{
  double dVar1;
  ulong uVar2;
  size_type sVar3;
  size_type sVar4;
  ulong uVar5;
  double *pdVar6;
  reference pvVar7;
  VectorFixSize<3U> *pVVar8;
  VectorDynSize *in_RDX;
  long in_RSI;
  VectorFixSize<3U> *in_RDI;
  Transform sensor_H_loadCell;
  Wrench loadCellWrench;
  size_t i;
  Wrench totalWrench;
  SpatialVector<iDynTree::SpatialForceVector> *in_stack_fffffffffffffd90;
  Transform local_1e0 [56];
  Wrench local_1a8;
  Rotation local_170 [72];
  Wrench local_128;
  GeomVector3 local_c8;
  GeomVector3 local_b0;
  Wrench local_98;
  ulong local_60;
  undefined1 local_48 [56];
  VectorDynSize *local_10;
  
  local_10 = in_RDX;
  sVar3 = iDynTree::VectorDynSize::size();
  sVar4 = std::vector<iDynTree::Position,_std::allocator<iDynTree::Position>_>::size
                    ((vector<iDynTree::Position,_std::allocator<iDynTree::Position>_> *)
                     (*(long *)(in_RSI + 8) + 0xa8));
  if (sVar3 == sVar4) {
    Wrench::Wrench((Wrench *)in_stack_fffffffffffffd90);
    SpatialVector<iDynTree::SpatialForceVector>::zero(in_stack_fffffffffffffd90);
    local_60 = 0;
    while( true ) {
      uVar2 = local_60;
      uVar5 = iDynTree::VectorDynSize::size();
      if (uVar5 <= uVar2) break;
      pdVar6 = (double *)iDynTree::VectorDynSize::operator()(local_10,local_60);
      iDynTree::GeomVector3::GeomVector3(&local_b0,0.0,0.0,*pdVar6);
      iDynTree::GeomVector3::GeomVector3(&local_c8,0.0,0.0,0.0);
      iDynTree::Wrench::Wrench(&local_98,&local_b0,&local_c8);
      iDynTree::Rotation::Identity();
      pvVar7 = std::vector<iDynTree::Position,_std::allocator<iDynTree::Position>_>::operator[]
                         ((vector<iDynTree::Position,_std::allocator<iDynTree::Position>_> *)
                          (*(long *)(in_RSI + 8) + 0xa8),local_60);
      iDynTree::Transform::Transform((Transform *)&local_128,local_170,pvVar7);
      iDynTree::Transform::operator*(local_1e0,&local_128);
      iDynTree::Wrench::operator+(&local_1a8,(Wrench *)local_48);
      iDynTree::Wrench::operator=((Wrench *)local_48,&local_1a8);
      Wrench::~Wrench((Wrench *)0x48dd1f);
      Wrench::~Wrench((Wrench *)0x48dd2c);
      Wrench::~Wrench((Wrench *)0x48dd39);
      local_60 = local_60 + 1;
    }
    VectorFixSize<3U>::VectorFixSize(in_RDI);
    pVVar8 = &SpatialVector<iDynTree::SpatialForceVector>::getLinearVec3
                        ((SpatialVector<iDynTree::SpatialForceVector> *)(local_48 + 8))->
              super_Vector3;
    pdVar6 = VectorFixSize<3U>::operator()(pVVar8,2);
    dVar1 = *pdVar6;
    pdVar6 = VectorFixSize<3U>::operator()(in_RDI,0);
    *pdVar6 = dVar1;
    pVVar8 = &SpatialVector<iDynTree::SpatialForceVector>::getAngularVec3
                        ((SpatialVector<iDynTree::SpatialForceVector> *)(local_48 + 8))->
              super_Vector3;
    pdVar6 = VectorFixSize<3U>::operator()(pVVar8,0);
    dVar1 = *pdVar6;
    pdVar6 = VectorFixSize<3U>::operator()(in_RDI,1);
    *pdVar6 = dVar1;
    pVVar8 = &SpatialVector<iDynTree::SpatialForceVector>::getAngularVec3
                        ((SpatialVector<iDynTree::SpatialForceVector> *)(local_48 + 8))->
              super_Vector3;
    pdVar6 = VectorFixSize<3U>::operator()(pVVar8,1);
    dVar1 = *pdVar6;
    pdVar6 = VectorFixSize<3U>::operator()(in_RDI,2);
    *pdVar6 = dVar1;
    Wrench::~Wrench((Wrench *)0x48df06);
  }
  else {
    iDynTree::reportError
              ("ThreeAxisForceTorqueContactSensor",
               "computeThreeAxisForceTorqueFromLoadCellMeasurements",
               "loadCellMeasurements has the wrong size");
    VectorFixSize<3U>::VectorFixSize(in_RDI);
    VectorFixSize<3U>::zero(in_RDI);
  }
  return in_RDI;
}

Assistant:

Vector3  ThreeAxisForceTorqueContactSensor::computeThreeAxisForceTorqueFromLoadCellMeasurements(VectorDynSize& loadCellMeasurements) const
{
    if (loadCellMeasurements.size() != pimpl->m_loadCellLocations.size())
    {
        reportError("ThreeAxisForceTorqueContactSensor","computeThreeAxisForceTorqueFromLoadCellMeasurements", "loadCellMeasurements has the wrong size");
        Vector3 zero; zero.zero();
        return zero;
    }

    Wrench totalWrench;
    totalWrench.zero();

    for (size_t i=0; i < loadCellMeasurements.size(); i++)
    {
        // We assume that the total forcetorque is given by the sum of pure forces on the z axis measured by the load cells
        Wrench loadCellWrench = Wrench(LinearForceVector3(0.0, 0.0, loadCellMeasurements(i)*1.0), AngularForceVector3(0.0, 0.0, 0.0));
        Transform sensor_H_loadCell(Rotation::Identity(), pimpl->m_loadCellLocations[i]);
        totalWrench = totalWrench + sensor_H_loadCell*loadCellWrench;
    }

    // Project the force torque
    Vector3 ret;
    ret(0) = totalWrench.getLinearVec3()(2);
    ret(1) = totalWrench.getAngularVec3()(0);
    ret(2) = totalWrench.getAngularVec3()(1);

    return ret;
}